

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

lyxml_ns * lyxml_get_ns(lyxml_elem *elem,char *prefix)

{
  int iVar1;
  lyxml_attr *local_28;
  lyxml_attr *attr;
  char *prefix_local;
  lyxml_elem *elem_local;
  
  if (elem == (lyxml_elem *)0x0) {
    elem_local = (lyxml_elem *)0x0;
  }
  else {
    for (local_28 = elem->attr; local_28 != (lyxml_attr *)0x0; local_28 = local_28->next) {
      if (local_28->type == LYXML_ATTR_NS) {
        if (local_28->name == (char *)0x0) {
          if (prefix == (char *)0x0) {
            if (local_28->value == (char *)0x0) {
              return (lyxml_ns *)0x0;
            }
            return (lyxml_ns *)local_28;
          }
        }
        else if ((prefix != (char *)0x0) && (iVar1 = strcmp(local_28->name,prefix), iVar1 == 0)) {
          return (lyxml_ns *)local_28;
        }
      }
    }
    elem_local = (lyxml_elem *)lyxml_get_ns(elem->parent,prefix);
  }
  return (lyxml_ns *)elem_local;
}

Assistant:

lyxml_ns *
lyxml_get_ns(const struct lyxml_elem *elem, const char *prefix)
{
    struct lyxml_attr *attr;

    if (!elem) {
        return NULL;
    }

    for (attr = elem->attr; attr; attr = attr->next) {
        if (attr->type != LYXML_ATTR_NS) {
            continue;
        }
        if (!attr->name) {
            if (!prefix) {
                /* default namespace found */
                if (!attr->value) {
                    /* empty default namespace -> no default namespace */
                    return NULL;
                }
                return (struct lyxml_ns *)attr;
            }
        } else if (prefix && !strcmp(attr->name, prefix)) {
            /* prefix found */
            return (struct lyxml_ns *)attr;
        }
    }

    /* go recursively */
    return lyxml_get_ns(elem->parent, prefix);
}